

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikcp.c
# Opt level: O2

int ikcp_recv(ikcpcb *kcp,char *buffer,int len)

{
  IQUEUEHEAD *pIVar1;
  uint uVar2;
  int iVar3;
  IUINT32 IVar4;
  IQUEUEHEAD *pIVar5;
  IQUEUEHEAD *pIVar6;
  IQUEUEHEAD *pIVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  IQUEUEHEAD *pIVar11;
  uint uVar12;
  
  if (kcp == (ikcpcb *)0x0) {
    __assert_fail("kcp",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/net_uv/kcp/ikcp.c"
                  ,0x16b,"int ikcp_recv(ikcpcb *, char *, int)");
  }
  pIVar1 = &kcp->rcv_queue;
  if (pIVar1 == (kcp->rcv_queue).next) {
    uVar8 = 0xffffffff;
  }
  else {
    uVar8 = ikcp_peeksize(kcp);
    if ((int)uVar8 < 0) {
      uVar8 = 0xfffffffe;
    }
    else {
      uVar9 = -len;
      if (0 < len) {
        uVar9 = len;
      }
      if (uVar9 < uVar8) {
        uVar8 = 0xfffffffd;
      }
      else {
        uVar9 = kcp->rcv_wnd;
        uVar2 = kcp->nrcv_que;
        uVar10 = 0;
        pIVar11 = (kcp->rcv_queue).next;
        do {
          if (pIVar11 == pIVar1) break;
          pIVar5 = pIVar11->next;
          if (buffer == (char *)0x0) {
            uVar12 = *(uint *)((long)&pIVar11[2].prev + 4);
            buffer = (char *)0x0;
          }
          else {
            memcpy(buffer,pIVar11 + 4,(ulong)*(uint *)((long)&pIVar11[2].prev + 4));
            uVar12 = *(uint *)((long)&pIVar11[2].prev + 4);
            buffer = buffer + uVar12;
          }
          iVar3 = *(int *)&pIVar11[1].prev;
          if (((kcp->logmask & 8) != 0) &&
             (kcp->writelog != (_func_void_char_ptr_IKCPCB_ptr_void_ptr *)0x0)) {
            ikcp_log(kcp,8,"recv sn=%lu",(ulong)*(uint *)((long)&pIVar11[2].next + 4));
          }
          if (-1 < len) {
            pIVar6 = pIVar11->next;
            pIVar7 = pIVar11->prev;
            pIVar6->prev = pIVar7;
            pIVar7->next = pIVar6;
            pIVar11->next = (IQUEUEHEAD *)0x0;
            pIVar11->prev = (IQUEUEHEAD *)0x0;
            ikcp_free(pIVar11);
            kcp->nrcv_que = kcp->nrcv_que - 1;
          }
          uVar10 = uVar10 + uVar12;
          pIVar11 = pIVar5;
        } while (iVar3 != 0);
        if (uVar10 != uVar8) {
          __assert_fail("len == peeksize",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/net_uv/kcp/ikcp.c"
                        ,0x199,"int ikcp_recv(ikcpcb *, char *, int)");
        }
        while (pIVar11 = (kcp->rcv_buf).next, &kcp->rcv_buf != pIVar11) {
          IVar4 = *(IUINT32 *)((long)&pIVar11[2].next + 4);
          uVar10 = kcp->nrcv_que;
          if ((IVar4 != kcp->rcv_nxt) || (kcp->rcv_wnd <= uVar10)) goto LAB_00153b1f;
          pIVar5 = pIVar11->next;
          pIVar6 = pIVar11->prev;
          pIVar5->prev = pIVar6;
          pIVar6->next = pIVar5;
          pIVar11->next = (IQUEUEHEAD *)0x0;
          pIVar11->prev = (IQUEUEHEAD *)0x0;
          kcp->nrcv_buf = kcp->nrcv_buf - 1;
          pIVar5 = (kcp->rcv_queue).prev;
          pIVar11->prev = pIVar5;
          pIVar11->next = pIVar1;
          pIVar5->next = pIVar11;
          (kcp->rcv_queue).prev = pIVar11;
          kcp->nrcv_que = uVar10 + 1;
          kcp->rcv_nxt = IVar4 + 1;
        }
        uVar10 = kcp->nrcv_que;
LAB_00153b1f:
        if ((uVar9 <= uVar2) && (uVar10 < kcp->rcv_wnd)) {
          *(byte *)&kcp->probe = (byte)kcp->probe | 2;
        }
      }
    }
  }
  return uVar8;
}

Assistant:

int ikcp_recv(ikcpcb *kcp, char *buffer, int len)
{
	struct IQUEUEHEAD *p;
	int ispeek = (len < 0)? 1 : 0;
	int peeksize;
	int recover = 0;
	IKCPSEG *seg;
	assert(kcp);

	if (iqueue_is_empty(&kcp->rcv_queue))
		return -1;

	if (len < 0) len = -len;

	peeksize = ikcp_peeksize(kcp);

	if (peeksize < 0) 
		return -2;

	if (peeksize > len) 
		return -3;

	if (kcp->nrcv_que >= kcp->rcv_wnd)
		recover = 1;

	// merge fragment
	for (len = 0, p = kcp->rcv_queue.next; p != &kcp->rcv_queue; ) {
		int fragment;
		seg = iqueue_entry(p, IKCPSEG, node);
		p = p->next;

		if (buffer) {
			memcpy(buffer, seg->data, seg->len);
			buffer += seg->len;
		}

		len += seg->len;
		fragment = seg->frg;

		if (ikcp_canlog(kcp, IKCP_LOG_RECV)) {
			ikcp_log(kcp, IKCP_LOG_RECV, "recv sn=%lu", seg->sn);
		}

		if (ispeek == 0) {
			iqueue_del(&seg->node);
			ikcp_segment_delete(kcp, seg);
			kcp->nrcv_que--;
		}

		if (fragment == 0) 
			break;
	}

	assert(len == peeksize);

	// move available data from rcv_buf -> rcv_queue
	while (! iqueue_is_empty(&kcp->rcv_buf)) {
		IKCPSEG *seg = iqueue_entry(kcp->rcv_buf.next, IKCPSEG, node);
		if (seg->sn == kcp->rcv_nxt && kcp->nrcv_que < kcp->rcv_wnd) {
			iqueue_del(&seg->node);
			kcp->nrcv_buf--;
			iqueue_add_tail(&seg->node, &kcp->rcv_queue);
			kcp->nrcv_que++;
			kcp->rcv_nxt++;
		}	else {
			break;
		}
	}

	// fast recover
	if (kcp->nrcv_que < kcp->rcv_wnd && recover) {
		// ready to send back IKCP_CMD_WINS in ikcp_flush
		// tell remote my window size
		kcp->probe |= IKCP_ASK_TELL;
	}

	return len;
}